

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O3

QList<QGesture_*> * __thiscall
QGestureEvent::activeGestures(QList<QGesture_*> *__return_storage_ptr__,QGestureEvent *this)

{
  long lVar1;
  QGesture **ppQVar2;
  QGesture *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QGesture *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGesture **)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (this->m_gestures).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->m_gestures).d.ptr;
    lVar4 = 0;
    do {
      pQVar3 = *(QGesture **)((long)ppQVar2 + lVar4);
      if (*(int *)(*(long *)&pQVar3->field_0x8 + 0x7c) != 4) {
        local_38 = pQVar3;
        QtPrivate::QPodArrayOps<QGesture*>::emplace<QGesture*&>
                  ((QPodArrayOps<QGesture*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_38);
        QList<QGesture_*>::end(__return_storage_ptr__);
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGesture *> QGestureEvent::activeGestures() const
{
    QList<QGesture *> gestures;
    for (QGesture *gesture : m_gestures) {
        if (gesture->state() != Qt::GestureCanceled)
            gestures.append(gesture);
    }
    return gestures;
}